

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O3

Am_Point_List * __thiscall
Am_Point_List::Append(Am_Point_List *this,Am_Point_List *other_list,bool unique)

{
  Am_Point_Item **ppAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Point_Item *pAVar3;
  Am_Point_List_Data *pAVar4;
  Am_Point_List_Data *pAVar5;
  
  pAVar4 = this->data;
  if (pAVar4 == (Am_Point_List_Data *)0x0) {
    pAVar4 = (Am_Point_List_Data *)operator_new(0x20);
    Am_Point_List_Data::Am_Point_List_Data(pAVar4);
  }
  else {
    if ((!unique) || ((pAVar4->super_Am_Wrapper).refs == 1)) goto LAB_001a2c39;
    iVar2 = (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar4 = (Am_Point_List_Data *)CONCAT44(extraout_var,iVar2);
    pAVar3 = this->item;
    pAVar5 = pAVar4;
    if (pAVar3 != (Am_Point_Item *)0x0) {
      do {
        pAVar3 = pAVar3->prev;
        ppAVar1 = &pAVar5->head;
        pAVar5 = (Am_Point_List_Data *)*ppAVar1;
      } while (pAVar3 != (Am_Point_Item *)0x0);
      this->item = *ppAVar1;
    }
  }
  this->data = pAVar4;
LAB_001a2c39:
  pAVar4 = other_list->data;
  if (pAVar4 != (Am_Point_List_Data *)0x0) goto LAB_001a2c5a;
  pAVar3 = other_list->item;
  while( true ) {
    if (pAVar3 == (Am_Point_Item *)0x0) {
      return this;
    }
    Add(this,pAVar3->x,pAVar3->y,Am_TAIL,false);
    pAVar4 = (Am_Point_List_Data *)other_list->item;
    if ((pAVar4 == (Am_Point_List_Data *)0x0) &&
       (pAVar4 = other_list->data, pAVar4 == (Am_Point_List_Data *)0x0)) break;
LAB_001a2c5a:
    pAVar3 = pAVar4->head;
    other_list->item = pAVar3;
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::Append(Am_Point_List other_list, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Point_List_Data();

  float x, y;
  for (other_list.Start(); !other_list.Last(); other_list.Next()) {
    other_list.Get(x, y);
    Add(x, y, Am_TAIL, false); //only need to make me unique once
  }
  return *this;
}